

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_colorized_console.cpp
# Opt level: O2

bool crnlib::colorized_console::console_output_func
               (eConsoleMessageType type,char *pMsg,void *param_3)

{
  char *__format;
  
  if (console::m_output_disabled == '\0') {
    __format = "%s";
    if (((console::m_prefixes == '\x01') && (type < cCMTTotal)) &&
       (console::m_at_beginning_of_line != '\0')) {
      __format = &DAT_00186564 + *(int *)(&DAT_00186564 + (ulong)type * 4);
    }
    printf(__format);
    if (console::m_crlf == '\x01') {
      putchar(10);
    }
  }
  return true;
}

Assistant:

bool colorized_console::console_output_func(eConsoleMessageType type, const char* pMsg, void*)
    {
        if (console::get_output_disabled())
        {
            return true;
        }

        if ((console::get_prefixes()) && (console::get_at_beginning_of_line()))
        {
            switch (type)
            {
            case cDebugConsoleMessage:
                printf("Debug: %s", pMsg);
                break;
            case cWarningConsoleMessage:
                printf("Warning: %s", pMsg);
                break;
            case cErrorConsoleMessage:
                printf("Error: %s", pMsg);
                break;
            default:
                printf("%s", pMsg);
                break;
            }
        }
        else
        {
            printf("%s", pMsg);
        }

        if (console::get_crlf())
        {
            printf("\n");
        }

        return true;
    }